

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (BinaryUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  idx_t iVar1;
  ulong uVar2;
  char *pcVar3;
  uint64_t lower;
  uint64_t upper;
  hugeint_t hVar4;
  hugeint_t value;
  string_t target;
  uhugeint_t local_30;
  idx_t len;
  
  local_30.lower = (uint64_t)this;
  local_30.upper = input.lower;
  hVar4 = uhugeint_t::operator_cast_to_hugeint_t(&local_30);
  value.upper = hVar4.upper;
  value.lower = value.upper;
  iVar1 = CountZeros<duckdb::hugeint_t>::Leading((CountZeros<duckdb::hugeint_t> *)hVar4.lower,value)
  ;
  if (iVar1 == 0x80) {
    target = StringVector::EmptyString((StringVector *)input.upper,(Vector *)0x1,len);
    pcVar3 = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      pcVar3 = target.value.pointer.prefix;
    }
    *pcVar3 = '0';
  }
  else {
    target = StringVector::EmptyString((StringVector *)input.upper,(Vector *)(0x80 - iVar1),len);
    pcVar3 = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      pcVar3 = target.value.pointer.prefix;
    }
    for (uVar2 = 0x7f - iVar1; 0x40 < uVar2 + 1; uVar2 = uVar2 - 1) {
      *pcVar3 = (input.lower >> ((ulong)((int)uVar2 - 0x40U & 0xff) & 0x3f) & 1) != 0 | 0x30;
      pcVar3 = pcVar3 + 1;
    }
    for (; uVar2 != 0xffffffffffffffff; uVar2 = uVar2 - 1) {
      *pcVar3 = ((ulong)this >> (uVar2 & 0x3f) & 1) != 0 | 0x30;
      pcVar3 = pcVar3 + 1;
    }
  }
  string_t::Finalize(&target);
  return (string_t)target.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}